

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

void pred_dual_interp_filter_rd
               (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,
               BUFFER_SET *orig_dst,int64_t *rd,RD_STATS *rd_stats_y,RD_STATS *rd_stats,
               int *switchable_rate,BUFFER_SET **dst_bufs,int *switchable_ctx,int skip_pred,
               INTERP_PRED_TYPE pred_filt_type,int_interpfilters *af,int_interpfilters *lf)

{
  BLOCK_SIZE in_CL;
  TileDataEnc *in_RDX;
  AV1_COMP *in_RSI;
  MACROBLOCK *in_RDI;
  BUFFER_SET *in_R8;
  int64_t *in_R9;
  RD_STATS *in_stack_00000010;
  RD_STATS *in_stack_00000018;
  int *in_stack_00000020;
  BUFFER_SET **in_stack_00000028;
  undefined4 in_stack_00000030;
  undefined4 in_stack_00000034;
  char cStack0000000000000038;
  int filt_type;
  uint16_t allowed_interp_mask;
  uint16_t local_52;
  
  local_52 = 0;
  if (cStack0000000000000038 == '\x01') {
    local_52 = av1_interp_dual_filt_mask[(int)((_cStack0000000000000038 & 0xff) - 1)]
               [*(ushort *)(CONCAT62(stack0x00000042,(uint16_t)filt_type) + 2)];
  }
  else if (cStack0000000000000038 == '\x02') {
    local_52 = av1_interp_dual_filt_mask[(int)((_cStack0000000000000038 & 0xff) - 1)]
               [*(ushort *)CONCAT62(stack0x00000042,(uint16_t)filt_type)];
  }
  else {
    set_interp_filter_allowed_mask
              (&local_52,
               (char)*(undefined2 *)(CONCAT62(stack0x00000042,(uint16_t)filt_type) + 2) +
               (char)*(undefined2 *)CONCAT62(stack0x00000042,(uint16_t)filt_type) * '\x03');
  }
  reset_interp_filter_allowed_mask(&local_52,'\0');
  find_best_interp_rd_facade
            (in_RDI,in_RSI,in_RDX,in_CL,in_R8,in_R9,in_stack_00000010,in_stack_00000018,
             in_stack_00000020,in_stack_00000028,
             (int *)CONCAT44(in_stack_00000034,in_stack_00000030),_cStack0000000000000038,
             (uint16_t)filt_type,(int)rd);
  return;
}

Assistant:

static inline void pred_dual_interp_filter_rd(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const orig_dst, int64_t *const rd, RD_STATS *rd_stats_y,
    RD_STATS *rd_stats, int *const switchable_rate,
    const BUFFER_SET *dst_bufs[2], const int switchable_ctx[2],
    const int skip_pred, INTERP_PRED_TYPE pred_filt_type, int_interpfilters *af,
    int_interpfilters *lf) {
  (void)lf;
  assert(pred_filt_type > INTERP_HORZ_NEQ_VERT_NEQ);
  assert(pred_filt_type < INTERP_PRED_TYPE_ALL);
  uint16_t allowed_interp_mask = 0;

  if (pred_filt_type == INTERP_HORZ_EQ_VERT_NEQ) {
    // pred_filter_search = 1: Only horizontal filter is matching
    allowed_interp_mask =
        av1_interp_dual_filt_mask[pred_filt_type - 1][af->as_filters.x_filter];
  } else if (pred_filt_type == INTERP_HORZ_NEQ_VERT_EQ) {
    // pred_filter_search = 2: Only vertical filter is matching
    allowed_interp_mask =
        av1_interp_dual_filt_mask[pred_filt_type - 1][af->as_filters.y_filter];
  } else {
    // pred_filter_search = 3: Both horizontal and vertical filter are matching
    int filt_type =
        af->as_filters.x_filter + af->as_filters.y_filter * SWITCHABLE_FILTERS;
    set_interp_filter_allowed_mask(&allowed_interp_mask, filt_type);
  }
  // REG_REG is already been evaluated in the beginning
  reset_interp_filter_allowed_mask(&allowed_interp_mask, REG_REG);
  find_best_interp_rd_facade(x, cpi, tile_data, bsize, orig_dst, rd, rd_stats_y,
                             rd_stats, switchable_rate, dst_bufs,
                             switchable_ctx, skip_pred, allowed_interp_mask, 0);
}